

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O2

int Bbl_ManCheck(Bbl_Man_t *p)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  iVar4 = 1;
  uVar5 = 0;
  while (((int)uVar5 < p->pObjs->nSize && (pcVar1 = p->pObjs->pArray, pcVar1 != (char *)0x0))) {
    uVar2 = *(uint *)(pcVar1 + (ulong)uVar5 + 8);
    if (((uVar2 & 3) == 0) && (*(int *)(pcVar1 + (ulong)uVar5 + 4) == -1)) {
      iVar4 = 0;
      printf("Bbl_ManCheck(): Node %d does not have function specified.\n",
             (ulong)*(uint *)(pcVar1 + uVar5));
      uVar2 = *(uint *)(pcVar1 + (ulong)uVar5 + 8);
    }
    if (((uVar2 & 1) != 0) && (*(int *)(pcVar1 + (ulong)uVar5 + 4) != -1)) {
      iVar4 = 0;
      printf("Bbl_ManCheck(): CI with %d has function specified.\n",(ulong)*(uint *)(pcVar1 + uVar5)
            );
      uVar2 = *(uint *)(pcVar1 + (ulong)uVar5 + 8);
    }
    if (((uVar2 & 2) != 0) && (*(int *)(pcVar1 + (ulong)uVar5 + 4) != -1)) {
      iVar4 = 0;
      printf("Bbl_ManCheck(): CO with %d has function specified.\n",(ulong)*(uint *)(pcVar1 + uVar5)
            );
    }
    uVar3 = Vec_IntEntry(p->vFaninNums,*(int *)(pcVar1 + uVar5));
    uVar2 = *(uint *)(pcVar1 + (ulong)uVar5 + 8);
    if (uVar3 != uVar2 >> 4) {
      uVar2 = *(uint *)(pcVar1 + uVar5);
      uVar3 = Vec_IntEntry(p->vFaninNums,uVar2);
      iVar4 = 0;
      printf("Bbl_ManCheck(): Object %d has less fanins (%d) than declared (%d).\n",(ulong)uVar2,
             (ulong)uVar3,(ulong)(*(uint *)(pcVar1 + (ulong)uVar5 + 8) >> 4));
      uVar2 = *(uint *)(pcVar1 + (ulong)uVar5 + 8);
    }
    uVar5 = uVar5 + (uVar2 >> 4) * 4 + 0xc;
  }
  return iVar4;
}

Assistant:

int Bbl_ManCheck( Bbl_Man_t * p )
{
    Bbl_Obj_t * pObj;
    int h, RetValue = 1;
    Bbl_ManForEachObj_int( p->pObjs, pObj, h )
    {
        if ( Bbl_ObjIsNode(pObj) && pObj->Fnc == -1 )
            RetValue = 0, printf( "Bbl_ManCheck(): Node %d does not have function specified.\n", pObj->Id );
        if ( Bbl_ObjIsCi(pObj) && pObj->Fnc != -1 )
            RetValue = 0, printf( "Bbl_ManCheck(): CI with %d has function specified.\n", pObj->Id );
        if ( Bbl_ObjIsCo(pObj) && pObj->Fnc != -1 )
            RetValue = 0, printf( "Bbl_ManCheck(): CO with %d has function specified.\n", pObj->Id );
        if ( Vec_IntEntry(p->vFaninNums, pObj->Id) != (int)pObj->nFanins )
            RetValue = 0, printf( "Bbl_ManCheck(): Object %d has less fanins (%d) than declared (%d).\n", 
                pObj->Id, Vec_IntEntry(p->vFaninNums, pObj->Id), pObj->nFanins );
    }
    return RetValue;
}